

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Session::Session(Session *this)

{
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *this_00;
  bool bVar1;
  int iVar2;
  ReusableStringStream *pRVar3;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  IMutableContext *pIVar5;
  Config *pCVar6;
  ostream *poVar7;
  undefined1 auVar8 [12];
  Parser local_160 [2];
  exception *ex;
  reference local_90;
  exception_ptr *ex_ptr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *__range2;
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *pvStack_68;
  Colour colourGuard;
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  *exceptions;
  ReusableStringStream local_50;
  string local_40;
  undefined4 local_1c;
  undefined8 local_18;
  Session *local_10;
  Session *this_local;
  
  local_10 = this;
  Clara::Parser::Parser(&this->m_cli);
  ConfigData::ConfigData(&this->m_configData);
  Detail::unique_ptr<Catch::Config>::unique_ptr(&this->m_config,(nullptr_t)0x0);
  this->m_startupExceptions = false;
  if ((Session::alreadyInstantiated & 1U) != 0) {
    ReusableStringStream::ReusableStringStream(&local_50);
    SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)&exceptions,
               "/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/tests/catch_amalgamated.cpp"
               ,0x380);
    pRVar3 = ReusableStringStream::operator<<(&local_50,(SourceLineInfo *)&exceptions);
    pRVar3 = ReusableStringStream::operator<<(pRVar3,(char (*) [26])": Internal Catch2 error: ");
    pRVar3 = ReusableStringStream::operator<<
                       (pRVar3,(char (*) [53])"Only one instance of Catch::Session can ever be used"
                       );
    ReusableStringStream::str_abi_cxx11_(&local_40,pRVar3);
    throw_logic_error(&local_40);
  }
  pIVar4 = getRegistryHub();
  iVar2 = (*pIVar4->_vptr_IRegistryHub[6])();
  pvStack_68 = StartupExceptionRegistry::getExceptions
                         ((StartupExceptionRegistry *)CONCAT44(extraout_var,iVar2));
  bVar1 = std::
          vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
          ::empty(pvStack_68);
  if (!bVar1) {
    config(this);
    pIVar5 = getCurrentMutableContext();
    pCVar6 = Detail::unique_ptr<Catch::Config>::get(&this->m_config);
    (*(pIVar5->super_IContext)._vptr_IContext[7])(pIVar5,pCVar6);
    this->m_startupExceptions = true;
    Colour::Colour((Colour *)((long)&__range2 + 7),Red);
    poVar7 = cerr();
    poVar7 = std::operator<<(poVar7,"Errors occurred during startup!");
    std::operator<<(poVar7,'\n');
    this_00 = pvStack_68;
    __end2 = std::
             vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
             ::begin(pvStack_68);
    ex_ptr = (exception_ptr *)
             std::
             vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
             ::end(this_00);
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::__exception_ptr::exception_ptr_*,_std::vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>_>
                                *)&ex_ptr);
    if (bVar1) {
      local_90 = __gnu_cxx::
                 __normal_iterator<const_std::__exception_ptr::exception_ptr_*,_std::vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>_>
                 ::operator*(&__end2);
      std::__exception_ptr::exception_ptr::exception_ptr((exception_ptr *)&ex,local_90);
      auVar8 = std::rethrow_exception((exception_ptr)&ex);
      local_1c = auVar8._8_4_;
      local_18 = auVar8._0_8_;
      Colour::~Colour((Colour *)((long)&__range2 + 7));
      Detail::unique_ptr<Catch::Config>::~unique_ptr(&this->m_config);
      ConfigData::~ConfigData(&this->m_configData);
      Clara::Parser::~Parser(&this->m_cli);
      _Unwind_Resume(local_18);
    }
    Colour::~Colour((Colour *)((long)&__range2 + 7));
  }
  Session::alreadyInstantiated = true;
  makeCommandLineParser(local_160,&this->m_configData);
  Clara::Parser::operator=(&this->m_cli,local_160);
  Clara::Parser::~Parser(local_160);
  return;
}

Assistant:

Session::Session() {
        static bool alreadyInstantiated = false;
        if (alreadyInstantiated) {
            CATCH_TRY{ CATCH_INTERNAL_ERROR("Only one instance of Catch::Session can ever be used"); }
            CATCH_CATCH_ALL{ getMutableRegistryHub().registerStartupException(); }